

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<char,fmt::v5::basic_format_specs<char>>::hex_writer::operator()
          (hex_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  value_type vVar4;
  value_type *pvVar5;
  size_t sVar6;
  long lVar7;
  value_type vVar8;
  uint uVar9;
  long lVar10;
  char *digits;
  char *pcVar11;
  value_type *pvVar12;
  value_type avStack_23 [11];
  char buffer [10];
  
  pvVar5 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar6 = (it->super_truncating_iterator_base<char_*>).count_;
  vVar8 = it->blackhole_;
  pcVar11 = "0123456789ABCDEF";
  if (*(char *)(*(long *)(*(long *)this + 8) + 0x11) == 'x') {
    pcVar11 = "0123456789abcdef";
  }
  iVar1 = *(int *)(this + 8);
  lVar7 = (long)iVar1;
  pvVar12 = avStack_23 + lVar7;
  uVar9 = *(uint *)(*(long *)this + 0x10);
  do {
    *pvVar12 = pcVar11[uVar9 & 0xf];
    pvVar12 = pvVar12 + -1;
    bVar3 = 0xf < uVar9;
    uVar9 = uVar9 >> 4;
  } while (bVar3);
  if (0 < iVar1) {
    lVar10 = 0;
    do {
      vVar4 = avStack_23[lVar10 + 1];
      if (sVar6 + lVar10 < uVar2) {
        *pvVar5 = avStack_23[lVar10 + 1];
        pvVar5 = pvVar5 + 1;
        vVar4 = vVar8;
      }
      vVar8 = vVar4;
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
    sVar6 = sVar6 + lVar7;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pvVar5;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar6;
  it->blackhole_ = vVar8;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }